

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_resampling_backend_get_heap_size__linear
                    (void *pUserData,ma_resampler_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ma_linear_resampler_heap_layout heapLayout;
  ma_linear_resampler_config local_48;
  ma_linear_resampler_heap_layout local_28;
  
  local_48._16_8_ = ZEXT48((pConfig->linear).lpfOrder);
  local_48.format = pConfig->format;
  local_48.channels = pConfig->channels;
  local_48.sampleRateIn = pConfig->sampleRateIn;
  local_48.sampleRateOut = pConfig->sampleRateOut;
  local_48.lpfNyquistFactor = 1.0;
  if (pHeapSizeInBytes == (size_t *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *pHeapSizeInBytes = 0;
    mVar1 = ma_linear_resampler_get_heap_layout(&local_48,&local_28);
    if (mVar1 == MA_SUCCESS) {
      *pHeapSizeInBytes = local_28.sizeInBytes;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

static ma_linear_resampler_config ma_resampling_backend_get_config__linear(const ma_resampler_config* pConfig)
{
    ma_linear_resampler_config linearConfig;

    linearConfig = ma_linear_resampler_config_init(pConfig->format, pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut);
    linearConfig.lpfOrder = pConfig->linear.lpfOrder;

    return linearConfig;
}